

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_6ea29e::HandleVersionMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string version_max;
  string version_min;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_type local_a0;
  pointer local_98;
  undefined8 local_90;
  char *local_88;
  string local_80;
  string local_60;
  string local_40;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (uVar4 < 0x21) {
    local_b0._M_len = (size_t)&local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"VERSION not given an argument","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00241718:
    if ((size_type *)local_b0._M_len != &local_a0) {
      operator_delete((void *)local_b0._M_len,local_a0 + 1);
    }
    return false;
  }
  if (uVar4 != 0x40) {
    local_b0._M_len = (size_t)&local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"VERSION given too many arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00241718;
  }
  pbVar1 = pbVar2 + 1;
  lVar5 = std::__cxx11::string::find((char *)pbVar1,0x7dfd26,0);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)pbVar1);
  if (lVar5 == -1) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)pbVar1);
    if ((local_60._M_string_length == 0) || (local_80._M_string_length == 0)) {
      local_98 = pbVar2[1]._M_dataplus._M_p;
      local_a0 = pbVar2[1]._M_string_length;
      local_b0._M_len = 9;
      local_b0._M_str = "VERSION \"";
      local_90 = 0x31;
      local_88 = "\" does not have a version on both sides of \"...\".";
      views._M_len = 3;
      views._M_array = &local_b0;
      cmCatViews_abi_cxx11_(&local_40,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
      goto LAB_00241801;
    }
  }
  bVar3 = cmMakefile::SetPolicyVersion(status->Makefile,&local_60,&local_80);
LAB_00241801:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    return bVar3;
  }
  operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  return bVar3;
}

Assistant:

bool HandleVersionMode(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() <= 1) {
    status.SetError("VERSION not given an argument");
    return false;
  }
  if (args.size() >= 3) {
    status.SetError("VERSION given too many arguments");
    return false;
  }
  std::string const& version_string = args[1];

  // Separate the <min> version and any trailing ...<max> component.
  std::string::size_type const dd = version_string.find("...");
  std::string const version_min = version_string.substr(0, dd);
  std::string const version_max = dd != std::string::npos
    ? version_string.substr(dd + 3, std::string::npos)
    : std::string();
  if (dd != std::string::npos &&
      (version_min.empty() || version_max.empty())) {
    status.SetError(
      cmStrCat("VERSION \"", version_string,
               R"(" does not have a version on both sides of "...".)"));
    return false;
  }

  return status.GetMakefile().SetPolicyVersion(version_min, version_max);
}